

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openglrenderer.h
# Opt level: O3

bool __thiscall
rengine::OpenGLRenderer::readPixels(OpenGLRenderer *this,int x,int y,int w,int h,uint *bytes)

{
  ulong uVar1;
  
  if (0 < h) {
    uVar1 = (ulong)(uint)h;
    do {
      glReadPixels(x,y + -1 + (int)uVar1,w,1,0x1908,0x1401,bytes);
      bytes = bytes + w;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  return true;
}

Assistant:

inline bool OpenGLRenderer::readPixels(int x, int y, int w, int h, unsigned *bytes)
{
    // Read line-by-line and flip it so we get what we want out..
    // Slow as hell, but this is used for autotesting, so who cares..
    for (int i=0; i<h; ++i)
        glReadPixels(x, y + h - i - 1, w, 1, GL_RGBA, GL_UNSIGNED_BYTE, bytes + i * w);
    return true;
}